

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_write_header(p_ply ply)

{
  p_ply_element ptVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = fprintf((FILE *)ply->fp,"ply\nformat %s 1.0\n",ply_storage_mode_list[ply->storage_mode]);
  if (0 < iVar2) {
    lVar4 = -1;
    lVar5 = 0;
    do {
      lVar4 = lVar4 + 1;
      if (ply->ncomments <= lVar4) {
        lVar4 = -1;
        lVar5 = 0;
        goto LAB_0013f60f;
      }
      iVar2 = fprintf((FILE *)ply->fp,"comment %s\n",ply->comment + lVar5);
      lVar5 = lVar5 + 0x400;
    } while (0 < iVar2);
  }
  goto LAB_0013f638;
  while( true ) {
    iVar2 = fprintf((FILE *)ply->fp,"obj_info %s\n",ply->obj_info + lVar5);
    lVar5 = lVar5 + 0x400;
    if (iVar2 < 1) break;
LAB_0013f60f:
    lVar4 = lVar4 + 1;
    if (ply->nobj_infos <= lVar4) {
      lVar4 = 0;
      while( true ) {
        if (ply->nelements <= lVar4) {
          iVar2 = fprintf((FILE *)ply->fp,"end_header\n");
          return (uint)(0 < iVar2);
        }
        ptVar1 = ply->element + lVar4;
        iVar2 = fprintf((FILE *)ply->fp,"element %s %ld\n",ptVar1);
        if (iVar2 < 1) break;
        lVar5 = 0;
        for (lVar6 = 0; lVar6 < ptVar1->nproperties; lVar6 = lVar6 + 1) {
          uVar3 = (ulong)*(uint *)((long)&ptVar1->property->type + lVar5);
          if (uVar3 == 0x10) {
            iVar2 = fprintf((FILE *)ply->fp,"property list %s %s %s\n",
                            ply_type_list[*(uint *)((long)&ptVar1->property->length_type + lVar5)]);
          }
          else {
            iVar2 = fprintf((FILE *)ply->fp,"property %s %s\n",ply_type_list[uVar3]);
          }
          if (iVar2 < 1) goto LAB_0013f638;
          lVar5 = lVar5 + 0x128;
        }
        lVar4 = lVar4 + 1;
      }
      break;
    }
  }
LAB_0013f638:
  ply_ferror(ply,"Error writing to file");
  return 0;
}

Assistant:

int ply_write_header(p_ply ply) {
    long i, j;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    if (fprintf(ply->fp, "ply\nformat %s 1.0\n",
                ply_storage_mode_list[ply->storage_mode]) <= 0) goto error;
    for (i = 0; i < ply->ncomments; i++)
        if (fprintf(ply->fp, "comment %s\n", ply->comment + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nobj_infos; i++)
        if (fprintf(ply->fp, "obj_info %s\n", ply->obj_info + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        assert(element->property || element->nproperties == 0);
        assert(!element->property || element->nproperties > 0);
        if (fprintf(ply->fp, "element %s %ld\n", element->name,
                    element->ninstances) <= 0) goto error;
        for (j = 0; j < element->nproperties; j++) {
            p_ply_property property = &element->property[j];
            if (property->type == PLY_LIST) {
                if (fprintf(ply->fp, "property list %s %s %s\n",
                            ply_type_list[property->length_type],
                            ply_type_list[property->value_type],
                            property->name) <= 0) goto error;
            } else {
                if (fprintf(ply->fp, "property %s %s\n",
                            ply_type_list[property->type],
                            property->name) <= 0) goto error;
            }
        }
    }
    return fprintf(ply->fp, "end_header\n") > 0;
error:
    ply_ferror(ply, "Error writing to file");
    return 0;
}